

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall
duckdb_re2::Prog::ConfigurePrefixAccel(Prog *this,string *prefix,bool prefix_foldcase)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ulong uVar6;
  long lVar7;
  byte *pbVar8;
  uint64_t *__s;
  ulong uVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  ulong uVar11;
  ushort *puVar12;
  bool bVar13;
  uint16_t nfa [256];
  undefined8 uStack_280;
  ushort local_278 [12];
  byte *local_260;
  ulong local_258;
  byte local_250 [16];
  Prog *local_240;
  ulong local_238 [65];
  
  this->prefix_foldcase_ = prefix_foldcase;
  uVar6 = prefix->_M_string_length;
  this->prefix_size_ = uVar6;
  if ((int)CONCAT71(in_register_00000011,prefix_foldcase) == 0) {
    *(int *)&this->field_11 = (int)*(prefix->_M_dataplus)._M_p;
    if (uVar6 != 1) {
      *(int *)((long)&this->field_11 + 4) =
           (int)(prefix->_M_dataplus)._M_p[prefix->_M_string_length - 1];
    }
  }
  else {
    uVar9 = 9;
    if (uVar6 < 9) {
      uVar9 = uVar6;
    }
    this->prefix_size_ = uVar9;
    uStack_280 = 0x4921b1;
    std::__cxx11::string::substr((ulong)&local_260,(ulong)prefix);
    uVar6 = local_258;
    uStack_280 = 0x4921c6;
    memset(local_238,0,0x200);
    pbVar8 = local_260;
    if (uVar6 != 0) {
      uVar9 = 0;
      do {
        pbVar1 = local_260 + uVar9;
        uVar9 = uVar9 + 1;
        puVar12 = (ushort *)((long)local_238 + (ulong)*pbVar1 * 2);
        *puVar12 = *puVar12 | (ushort)(1 << ((byte)uVar9 & 0x1f));
      } while (uVar6 != uVar9);
    }
    lVar7 = 0;
    do {
      uVar9 = *(ulong *)((long)local_238 + lVar7 * 2 + 8);
      *(ulong *)((long)local_238 + lVar7 * 2) =
           *(ulong *)((long)local_238 + lVar7 * 2) | 0x1000100010001;
      *(ulong *)((long)local_238 + lVar7 * 2 + 8) = uVar9 | 0x1000100010001;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x100);
    local_278[4] = 0;
    local_278[5] = 0;
    local_278[6] = 0;
    local_278[7] = 0;
    local_278[8] = 0;
    local_278[9] = 0;
    local_278[0] = 1;
    local_278[1] = 0;
    local_278[2] = 0;
    local_278[3] = 0;
    if (uVar6 != 0) {
      uVar9 = 1;
      do {
        uVar10 = uVar9;
        if (uVar9 == uVar6) {
          uVar10 = 9;
        }
        local_278[uVar10] =
             *(short *)((long)&uStack_280 + uVar9 * 2 + 6) * 2 + 1U &
             *(ushort *)((long)local_238 + (ulong)pbVar8[uVar9 - 1] * 2);
        bVar13 = uVar9 != uVar6;
        uVar9 = uVar9 + 1;
      } while (bVar13);
      lVar7 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      uStack_280 = 0x492293;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar8,pbVar8 + uVar6,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      uStack_280 = 0x49229e;
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar8);
      pbVar8 = local_260 + local_258;
      if (local_258 != 0) {
        uVar9 = 1;
        do {
          uVar10 = uVar9;
          if (local_258 == uVar10) goto LAB_00492328;
          uVar9 = uVar10 + 1;
        } while (local_260[uVar10 - 1] != local_260[uVar10]);
        pbVar8 = local_260 + (uVar10 - 1);
        bVar3 = local_260[uVar10 - 1];
        for (; local_258 != uVar9; uVar9 = uVar9 + 1) {
          bVar2 = local_260[uVar9];
          if (bVar3 != bVar2) {
            pbVar8[1] = bVar2;
            pbVar8 = pbVar8 + 1;
          }
          bVar3 = bVar2;
        }
        pbVar8 = pbVar8 + 1;
      }
    }
LAB_00492328:
    local_258 = (long)pbVar8 - (long)local_260;
    *pbVar8 = 0;
    uStack_280 = 0x492345;
    __s = (uint64_t *)operator_new__(0x800);
    uStack_280 = 0x49235c;
    local_240 = this;
    memset(__s,0,0x800);
    if (uVar6 != 0) {
      uVar9 = 0;
      do {
        if (local_258 != 0) {
          uVar4 = local_278[uVar9];
          pbVar8 = local_260;
          do {
            bVar3 = *pbVar8;
            uVar10 = (ulong)bVar3;
            lVar7 = -6;
            puVar12 = local_278;
            do {
              lVar7 = lVar7 + 6;
              uVar5 = *puVar12;
              puVar12 = puVar12 + 1;
            } while (uVar5 != (*(ushort *)((long)local_238 + uVar10 * 2) & uVar4 * 2 + 1));
            uVar11 = lVar7 << ((char)uVar9 * '\x06' & 0x3fU);
            __s[uVar10] = __s[uVar10] | uVar11;
            if ((byte)(bVar3 + 0x9f) < 0x1a) {
              __s[uVar10 - 0x20] = __s[uVar10 - 0x20] | uVar11;
            }
            pbVar8 = pbVar8 + 1;
          } while (pbVar8 != local_260 + local_258);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar6);
    }
    lVar7 = 0;
    do {
      uVar6 = (__s + lVar7)[1];
      __s[lVar7] = __s[lVar7] | 0xd80000000000000;
      (__s + lVar7)[1] = uVar6 | 0xd80000000000000;
      lVar7 = lVar7 + 2;
    } while (lVar7 != 0x100);
    (local_240->field_11).prefix_dfa_ = __s;
    if (local_260 != local_250) {
      uStack_280 = 0x49241b;
      operator_delete(local_260);
    }
  }
  return;
}

Assistant:

void Prog::ConfigurePrefixAccel(const std::string& prefix,
                                bool prefix_foldcase) {
  prefix_foldcase_ = prefix_foldcase;
  prefix_size_ = prefix.size();
  if (prefix_foldcase_) {
    // Use PrefixAccel_ShiftDFA().
    // ... and no more than nine bytes of the prefix. (See above for details.)
    prefix_size_ = std::min(prefix_size_, kShiftDFAFinal);
    prefix_dfa_ = BuildShiftDFA(prefix.substr(0, prefix_size_));
  } else if (prefix_size_ != 1) {
    // Use PrefixAccel_FrontAndBack().
    prefix_front_back.prefix_front_ = prefix.front();
	prefix_front_back.prefix_back_ = prefix.back();
  } else {
    // Use memchr(3).
	prefix_front_back.prefix_front_ = prefix.front();
  }
}